

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::ClearJoins(Clipper *this)

{
  pointer ppJVar1;
  size_type i;
  ulong uVar2;
  
  for (uVar2 = 0;
      ppJVar1 = (this->m_Joins).
                super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar2 < (ulong)((long)(this->m_Joins).
                            super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppJVar1 >> 3);
      uVar2 = uVar2 + 1) {
    operator_delete(ppJVar1[uVar2],0x20);
  }
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::resize(&this->m_Joins,0);
  return;
}

Assistant:

void Clipper::ClearJoins()
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
    delete m_Joins[i];
  m_Joins.resize(0);
}